

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontSym.cpp
# Opt level: O0

void __thiscall
TPZFrontSym<std::complex<double>_>::Reset
          (TPZFrontSym<std::complex<double>_> *this,int64_t GlobalSize)

{
  long in_RDI;
  int64_t in_stack_00000008;
  TPZManVector<long,_10> *in_stack_00000010;
  long *in_stack_00000028;
  TPZVec<long> *in_stack_00000030;
  int64_t in_stack_00000048;
  TPZVec<std::complex<double>_> *in_stack_00000050;
  
  TPZVec<std::complex<double>_>::Resize(in_stack_00000050,in_stack_00000048);
  TPZManVector<int,_10>::Resize((TPZManVector<int,_10> *)in_stack_00000010,in_stack_00000008);
  *(undefined8 *)(in_RDI + 0xa0) = 0;
  TPZManVector<long,_10>::Resize(in_stack_00000010,in_stack_00000008);
  TPZVec<long>::Resize(&in_stack_00000010->super_TPZVec<long>,in_stack_00000008);
  TPZVec<long>::Fill(in_stack_00000030,in_stack_00000028,(int64_t)this,GlobalSize);
  *(undefined4 *)(in_RDI + 0xc) = 0;
  return;
}

Assistant:

void TPZFrontSym<TVar>::Reset(int64_t GlobalSize)
{
	this->fData.Resize(0);
	this->fFree.Resize(0);
	this->fFront=0;
	this->fGlobal.Resize(0);
	this->fLocal.Resize(GlobalSize);
	this->fLocal.Fill(-1);
	this->fMaxFront=0;
}